

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::ShouldEmitIntRangeCheck(Instr *this)

{
  OpCode OVar1;
  bool bVar2;
  
  OVar1 = this->m_opcode;
  bVar2 = true;
  if ((((5 < OVar1 - 0x97) || ((0x2dU >> (OVar1 - 0x97 & 0x1f) & 1) == 0)) && (OVar1 != ToVar)) &&
     (OVar1 != StElemC)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
Instr::ShouldEmitIntRangeCheck()
{
    // currently only emitting int range check for opnds of instructions with following opcodes:
    return m_opcode == Js::OpCode::ToVar ||
        m_opcode == Js::OpCode::LdElemI_A ||
        m_opcode == Js::OpCode::LdMethodElem ||
        m_opcode == Js::OpCode::StElemI_A ||
        m_opcode == Js::OpCode::StElemI_A_Strict ||
        m_opcode == Js::OpCode::StElemC;
}